

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

int64_t absl::lts_20250127::IDivDuration(Duration num,Duration den,Duration *rem)

{
  bool bVar1;
  long lVar2;
  HiRep HVar3;
  int64_t iVar4;
  uint uVar5;
  uint uVar6;
  HiRep HVar7;
  HiRep HVar8;
  ulong uVar9;
  
  uVar6 = num.rep_lo_;
  HVar8 = num.rep_hi_;
  uVar5 = den.rep_lo_;
  HVar7 = den.rep_hi_;
  if (uVar5 != 0xffffffff && uVar6 != 0xffffffff) {
    if (HVar7 == (HiRep)0x0) {
      HVar3.lo_ = 0;
      HVar3.hi_ = 0;
      bVar1 = false;
      if ((int)uVar5 < 4000) {
        if (uVar5 == 4) {
          if ((ulong)HVar8 >> 8 < 0x225c17d) {
            lVar2 = (long)HVar8 * 1000000000;
            uVar9 = (ulong)(uVar6 >> 2);
LAB_0034185b:
            HVar3 = (HiRep)(uVar9 + lVar2);
            HVar7.lo_ = 0;
            HVar7.hi_ = 0;
            uVar6 = uVar6 % uVar5;
            goto LAB_00341869;
          }
        }
        else {
          if (uVar5 != 400) goto LAB_00341878;
          if ((ulong)HVar8 < 0xd6bf94d455) {
            lVar2 = (long)HVar8 * 10000000;
            uVar9 = (ulong)uVar6 / 400;
            goto LAB_0034185b;
          }
        }
      }
      else if (uVar5 == 4000) {
        if ((ulong)HVar8 < 0x8637bd04b56) {
          lVar2 = (long)HVar8 * 1000000;
          uVar9 = (ulong)uVar6 / 4000;
          goto LAB_0034185b;
        }
      }
      else {
        if (uVar5 != 4000000) goto LAB_00341878;
        if ((ulong)HVar8 < 0x20c49ba5a64af7) {
          lVar2 = (long)HVar8 * 1000;
          uVar9 = (ulong)uVar6 / 4000000;
          goto LAB_0034185b;
        }
      }
    }
    else if (uVar5 == 0 && 0 < (long)HVar7) {
      if ((long)HVar8 < 0) {
        lVar2 = (ulong)(uVar6 != 0) + (long)HVar8;
        HVar3 = (HiRep)(lVar2 / (long)HVar7);
        HVar7 = (HiRep)(lVar2 % (long)HVar7 - (ulong)(uVar6 != 0));
      }
      else if (HVar7 == (HiRep)0x1) {
        HVar7.lo_ = 0;
        HVar7.hi_ = 0;
        HVar3 = HVar8;
      }
      else {
        HVar3 = (HiRep)((ulong)HVar8 / (ulong)HVar7);
        HVar7 = (HiRep)((ulong)HVar8 % (ulong)HVar7);
      }
LAB_00341869:
      rem->rep_hi_ = HVar7;
      rem->rep_lo_ = uVar6;
      bVar1 = true;
      goto LAB_00341878;
    }
  }
  HVar3.lo_ = 0;
  HVar3.hi_ = 0;
  bVar1 = false;
LAB_00341878:
  if (bVar1) {
    return (int64_t)HVar3;
  }
  iVar4 = anon_unknown_1::IDivSlowPath(true,num,den,rem);
  return iVar4;
}

Assistant:

int64_t IDivDuration(Duration num, Duration den, Duration* rem) {
  return IDivDurationImpl(true, num, den,
                          rem);  // trunc towards zero
}